

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

void JS_AddIntrinsicDate(JSContext *ctx)

{
  JSValue *pJVar1;
  JSValue JVar2;
  JSValue func_obj;
  
  pJVar1 = ctx->class_proto;
  JVar2 = JS_NewObjectProtoClass(ctx,pJVar1[1],1);
  pJVar1[10] = JVar2;
  JS_SetPropertyFunctionList(ctx,ctx->class_proto[10],js_date_proto_funcs,0x2f);
  JVar2 = ctx->class_proto[10];
  func_obj = JS_NewCFunction3(ctx,js_date_constructor,"Date",7,JS_CFUNC_constructor_or_func,0,
                              ctx->function_proto);
  JS_NewGlobalCConstructor2(ctx,func_obj,"Date",JVar2);
  JS_SetPropertyFunctionList(ctx,func_obj,js_date_funcs,3);
  return;
}

Assistant:

void JS_AddIntrinsicDate(JSContext *ctx)
{
    JSValueConst obj;

    /* Date */
    ctx->class_proto[JS_CLASS_DATE] = JS_NewObject(ctx);
    JS_SetPropertyFunctionList(ctx, ctx->class_proto[JS_CLASS_DATE], js_date_proto_funcs,
                               countof(js_date_proto_funcs));
    obj = JS_NewGlobalCConstructor(ctx, "Date", js_date_constructor, 7,
                                   ctx->class_proto[JS_CLASS_DATE]);
    JS_SetPropertyFunctionList(ctx, obj, js_date_funcs, countof(js_date_funcs));
}